

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZFNMatrix<9,_double>,_18>::~TPZManVector
          (TPZManVector<TPZFNMatrix<9,_double>,_18> *this)

{
  long lVar1;
  
  (this->super_TPZVec<TPZFNMatrix<9,_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01735e70;
  if ((this->super_TPZVec<TPZFNMatrix<9,_double>_>).fStore == this->fExtAlloc) {
    (this->super_TPZVec<TPZFNMatrix<9,_double>_>).fStore = (TPZFNMatrix<9,_double> *)0x0;
  }
  (this->super_TPZVec<TPZFNMatrix<9,_double>_>).fNAlloc = 0;
  lVar1 = 0xf00;
  do {
    TPZFNMatrix<9,_double>::~TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)
               ((long)this->fExtAlloc[0].super_TPZFMatrix<double>.fPivot.fExtAlloc + lVar1 + -0x78))
    ;
    lVar1 = lVar1 + -0xe0;
  } while (lVar1 != -0xc0);
  TPZVec<TPZFNMatrix<9,_double>_>::~TPZVec(&this->super_TPZVec<TPZFNMatrix<9,_double>_>);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}